

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O0

void __thiscall jsonip::writer<true>::array_end(writer<true> *this)

{
  ostream *poVar1;
  string local_30;
  writer<true> *local_10;
  writer<true> *this_local;
  
  this->level = this->level - 1;
  local_10 = this;
  poVar1 = std::operator<<(this->os,'\n');
  indent_abi_cxx11_(&local_30,this);
  std::operator<<(poVar1,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::operator<<(this->os,']');
  this->comma = true;
  return;
}

Assistant:

void array_end()
        {
            --level;
            if (indent_)
            {
                os << '\n' << indent();
            }
            os << ']';
            comma = true;
        }